

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall DPolyAction::Destroy(DPolyAction *this)

{
  FPolyObj *pFVar1;
  long lVar2;
  DPolyAction *pDVar3;
  
  lVar2 = (long)po_NumPolyobjs;
  if (0 < lVar2) {
    pFVar1 = polyobjs;
    do {
      if (pFVar1->tag == this->m_PolyObj) goto LAB_0047005f;
      pFVar1 = pFVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  pFVar1 = (FPolyObj *)0x0;
LAB_0047005f:
  pDVar3 = (pFVar1->specialdata).field_0.p;
  if ((pDVar3 != (DPolyAction *)0x0) &&
     (((pDVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (pFVar1->specialdata).field_0.p = (DPolyAction *)0x0;
    pDVar3 = (DPolyAction *)0x0;
  }
  if (pDVar3 == this) {
    (pFVar1->specialdata).field_0.p = (DPolyAction *)0x0;
  }
  StopInterpolation(this);
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DPolyAction::Destroy()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly->specialdata == this)
	{
		poly->specialdata = NULL;
	}

	StopInterpolation();
	Super::Destroy();
}